

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

void free_effect(effect *source)

{
  effect *peVar1;
  effect *e_next;
  effect *e;
  effect *source_local;
  
  e_next = source;
  while (e_next != (effect *)0x0) {
    peVar1 = e_next->next;
    dice_free(e_next->dice);
    if (e_next->msg != (char *)0x0) {
      string_free(e_next->msg);
    }
    mem_free(e_next);
    e_next = peVar1;
  }
  return;
}

Assistant:

void free_effect(struct effect *source)
{
	struct effect *e = source, *e_next;
	while (e) {
		e_next = e->next;
		dice_free(e->dice);
		if (e->msg) {
			string_free(e->msg);
		}
		mem_free(e);
		e = e_next;
	}
}